

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

int nni_http_set_version(nng_http *conn,char *vers)

{
  int iVar1;
  long lVar2;
  char *__s2;
  
  __s2 = "HTTP/1.1";
  if (vers == (char *)0x0) {
    vers = "HTTP/1.1";
  }
  lVar2 = 1;
  do {
    iVar1 = strcmp(vers,__s2);
    if (iVar1 == 0) {
      conn->vers = __s2;
      return 0;
    }
    __s2 = nni_http_set_version::http_versions[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  return 9;
}

Assistant:

int
nni_http_set_version(nng_http *conn, const char *vers)
{
	static const char *http_versions[] = {
		// for efficiency, we order in most likely first
		"HTTP/1.1",
		"HTTP/2",
		"HTTP/3",
		"HTTP/1.0",
		"HTTP/0.9",
		NULL,
	};

	vers = vers != NULL ? vers : NNG_HTTP_VERSION_1_1;
	for (int i = 0; http_versions[i] != NULL; i++) {
		if (strcmp(vers, http_versions[i]) == 0) {
			conn->vers = http_versions[i];
			return (NNG_OK);
		}
	}
	return (NNG_ENOTSUP);
}